

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferred
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  size_t *__s;
  pointer pvVar1;
  pointer pBVar2;
  size_t sVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  long lVar8;
  size_t **ppsVar9;
  size_t *psVar10;
  size_t *psVar11;
  bool bVar12;
  _Hash_node_base *p_Var13;
  pointer puVar14;
  BlockInfo *b;
  pointer pBVar15;
  size_t sVar16;
  CoreDims local_608;
  undefined1 local_5f8 [16];
  CoreDims local_5e8;
  undefined1 local_5d8 [16];
  CoreDims local_5c8;
  undefined1 local_5b8 [16];
  CoreDims local_5a8;
  undefined1 local_598 [16];
  _Hash_node_base *local_588;
  DimsArray vStart;
  DimsArray vCount;
  DimsArray vMemCount;
  DimsArray vMemStart;
  DimsArray vShape;
  
  if (*(int *)(variable + 0x28) == 0xe) {
    if ((((this->super_SscReaderBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      GetDeferredDeltaCommon(this,variable,data);
      return;
    }
    p_Var13 = (this->m_AllReceivingWriterRanks)._M_h._M_before_begin._M_nxt;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      do {
        pvVar1 = (this->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = *(pointer *)
                  ((long)&pvVar1[*(int *)&p_Var13[1]._M_nxt].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pBVar15 = pvVar1[*(int *)&p_Var13[1]._M_nxt].
                       super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar15 != pBVar2;
            pBVar15 = pBVar15 + 1) {
          sVar3 = (pBVar15->name)._M_string_length;
          if ((sVar3 == *(size_t *)(variable + 0x10)) &&
             ((sVar3 == 0 ||
              (iVar7 = bcmp((pBVar15->name)._M_dataplus._M_p,*(void **)(variable + 8),sVar3),
              iVar7 == 0)))) {
            vStart.super_CoreDims.DimCount = (size_t)vStart.Dimensions;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                      ((string *)&vStart,
                       (pBVar15->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       *(pointer *)
                        ((long)&(pBVar15->value).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl + 8));
            std::__cxx11::string::operator=((string *)data,(string *)&vStart);
            if ((size_t *)vStart.super_CoreDims.DimCount != vStart.Dimensions) {
              operator_delete((void *)vStart.super_CoreDims.DimCount);
            }
          }
        }
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
  }
  else {
    lVar4 = *(long *)(variable + 0x70);
    lVar8 = *(long *)(variable + 0x78);
    sVar16 = lVar8 - lVar4 >> 3;
    vStart.super_CoreDims.DimensSpan = vStart.Dimensions;
    vStart.super_CoreDims.DimCount = sVar16;
    memset(vStart.super_CoreDims.DimensSpan,0,0x100);
    if (lVar8 != lVar4) {
      lVar8 = 0;
      do {
        vStart.Dimensions[lVar8] = *(size_t *)(lVar4 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (sVar16 + (sVar16 == 0) != lVar8);
    }
    lVar4 = *(long *)(variable + 0x88);
    lVar8 = *(long *)(variable + 0x90);
    sVar16 = lVar8 - lVar4 >> 3;
    vCount.super_CoreDims.DimensSpan = vCount.Dimensions;
    vCount.super_CoreDims.DimCount = sVar16;
    memset(vCount.super_CoreDims.DimensSpan,0,0x100);
    if (lVar8 != lVar4) {
      lVar8 = 0;
      do {
        vCount.Dimensions[lVar8] = *(size_t *)(lVar4 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (sVar16 + (sVar16 == 0) != lVar8);
    }
    lVar4 = *(long *)(variable + 0x58);
    lVar8 = *(long *)(variable + 0x60);
    sVar16 = lVar8 - lVar4 >> 3;
    vShape.super_CoreDims.DimensSpan = vShape.Dimensions;
    vShape.super_CoreDims.DimCount = sVar16;
    memset(vShape.super_CoreDims.DimensSpan,0,0x100);
    if (lVar8 != lVar4) {
      lVar8 = 0;
      do {
        vShape.Dimensions[lVar8] = *(size_t *)(lVar4 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (sVar16 + (sVar16 == 0) != lVar8);
    }
    lVar4 = *(long *)(variable + 0xa0);
    lVar8 = *(long *)(variable + 0xa8);
    sVar16 = lVar8 - lVar4 >> 3;
    psVar11 = vMemStart.Dimensions;
    vMemStart.super_CoreDims.DimCount = sVar16;
    vMemStart.super_CoreDims.DimensSpan = psVar11;
    memset(psVar11,0,0x100);
    if (lVar8 != lVar4) {
      lVar8 = 0;
      do {
        vMemStart.Dimensions[lVar8] = *(size_t *)(lVar4 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (sVar16 + (sVar16 == 0) != lVar8);
    }
    lVar4 = *(long *)(variable + 0xb8);
    lVar8 = *(long *)(variable + 0xc0);
    sVar16 = lVar8 - lVar4 >> 3;
    __s = vMemCount.Dimensions;
    vMemCount.super_CoreDims.DimCount = sVar16;
    vMemCount.super_CoreDims.DimensSpan = __s;
    memset(__s,0,0x100);
    if (lVar8 != lVar4) {
      lVar8 = 0;
      do {
        vMemCount.Dimensions[lVar8] = *(size_t *)(lVar4 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (sVar16 + (sVar16 == 0) != lVar8);
    }
    if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
      ppsVar9 = (size_t **)(vStart.Dimensions + (vStart.super_CoreDims.DimCount - 1));
      if (vStart.Dimensions < ppsVar9 && vStart.super_CoreDims.DimCount != 0) {
        psVar10 = vStart.Dimensions;
        do {
          psVar10 = psVar10 + 1;
          sVar16 = psVar10[-1];
          psVar10[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar16;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar10 < ppsVar9);
      }
      ppsVar9 = (size_t **)(vCount.Dimensions + (vCount.super_CoreDims.DimCount - 1));
      if (vCount.Dimensions < ppsVar9 && vCount.super_CoreDims.DimCount != 0) {
        psVar10 = vCount.Dimensions;
        do {
          psVar10 = psVar10 + 1;
          sVar16 = psVar10[-1];
          psVar10[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar16;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar10 < ppsVar9);
      }
      ppsVar9 = (size_t **)(vShape.Dimensions + (vShape.super_CoreDims.DimCount - 1));
      if (vShape.Dimensions < ppsVar9 && vShape.super_CoreDims.DimCount != 0) {
        psVar10 = vShape.Dimensions;
        do {
          psVar10 = psVar10 + 1;
          sVar16 = psVar10[-1];
          psVar10[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar16;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar10 < ppsVar9);
      }
      ppsVar9 = (size_t **)(vMemStart.Dimensions + (vMemStart.super_CoreDims.DimCount - 1));
      if (psVar11 < ppsVar9 && vMemStart.super_CoreDims.DimCount != 0) {
        psVar11 = vMemStart.Dimensions;
        do {
          psVar11 = psVar11 + 1;
          sVar16 = psVar11[-1];
          psVar11[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar16;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar11 < ppsVar9);
      }
      ppsVar9 = (size_t **)(vMemCount.Dimensions + (vMemCount.super_CoreDims.DimCount - 1));
      if (__s < ppsVar9 && vMemCount.super_CoreDims.DimCount != 0) {
        psVar11 = vMemCount.Dimensions;
        do {
          psVar11 = psVar11 + 1;
          sVar16 = psVar11[-1];
          psVar11[-1] = (size_t)*ppsVar9;
          *ppsVar9 = (size_t *)sVar16;
          ppsVar9 = ppsVar9 + -1;
        } while (psVar11 < ppsVar9);
      }
    }
    if ((((this->super_SscReaderBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      GetDeferredDeltaCommon(this,variable,data);
    }
    else {
      for (p_Var13 = (this->m_AllReceivingWriterRanks)._M_h._M_before_begin._M_nxt;
          p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
        pvVar1 = (this->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = *(pointer *)
                  ((long)&pvVar1[*(int *)&p_Var13[1]._M_nxt].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        local_588 = p_Var13;
        for (pBVar15 = pvVar1[*(int *)&p_Var13[1]._M_nxt].
                       super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar15 != pBVar2;
            pBVar15 = pBVar15 + 1) {
          sVar3 = (pBVar15->name)._M_string_length;
          if ((sVar3 == *(size_t *)(variable + 0x10)) &&
             ((sVar3 == 0 ||
              (iVar7 = bcmp((pBVar15->name)._M_dataplus._M_p,*(void **)(variable + 8),sVar3),
              iVar7 == 0)))) {
            puVar5 = (pBVar15->count).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar6 = *(pointer *)
                      ((long)&(pBVar15->count).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8);
            if (puVar5 != puVar6) {
              bVar12 = false;
              puVar14 = puVar5;
              do {
                if (*puVar14 == 0) {
                  bVar12 = true;
                }
                puVar14 = puVar14 + 1;
              } while (puVar14 != puVar6);
              if (bVar12) goto LAB_00148c09;
            }
            switch(pBVar15->shapeId) {
            case GlobalValue:
            case LocalValue:
              memcpy(data,(this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar15->bufferStart,
                     pBVar15->bufferCount);
              break;
            case GlobalArray:
            case LocalArray:
              local_5e8.DimensSpan =
                   (pBVar15->start).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_5e8.DimCount =
                   (long)*(pointer *)
                          ((long)&(pBVar15->start).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl + 8) - (long)local_5e8.DimensSpan >> 3;
              local_608.DimCount = (long)puVar6 - (long)puVar5 >> 3;
              local_608.DimensSpan = puVar5;
              local_5c8.DimCount = local_608.DimCount;
              local_5c8.DimensSpan = puVar5;
              local_5a8.DimCount = local_5e8.DimCount;
              local_5a8.DimensSpan = local_5e8.DimensSpan;
              adios2::helper::NdCopy
                        ((char *)((this->super_SscReaderBase).m_Buffer.m_Buffer +
                                 pBVar15->bufferStart),&local_5a8,&local_5c8,true,true,(char *)data,
                         &vStart.super_CoreDims,&vCount.super_CoreDims,true,true,
                         *(int *)(variable + 0x30),&local_5e8,&local_608,&vMemStart.super_CoreDims,
                         &vMemCount.super_CoreDims,false,Host,false);
              break;
            default:
              local_5a8.DimCount = (size_t)local_598;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Engine","");
              local_5c8.DimCount = (size_t)local_5b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5c8,"SscReaderGeneric","");
              local_5e8.DimCount = (size_t)local_5d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5e8,"GetDeferredCommon","");
              local_608.DimCount = (size_t)local_5f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_608,"unknown ShapeID","");
              iVar7 = (this->super_SscReaderBase).m_ReaderRank;
              adios2::helper::Log((string *)&local_5a8,(string *)&local_5c8,(string *)&local_5e8,
                                  (string *)&local_608,iVar7,iVar7,0,
                                  (this->super_SscReaderBase).m_Verbosity,FATALERROR);
              if ((undefined1 *)local_608.DimCount != local_5f8) {
                operator_delete((void *)local_608.DimCount);
              }
              p_Var13 = local_588;
              if ((undefined1 *)local_5e8.DimCount != local_5d8) {
                operator_delete((void *)local_5e8.DimCount);
              }
              if ((undefined1 *)local_5c8.DimCount != local_5b8) {
                operator_delete((void *)local_5c8.DimCount);
              }
              if ((undefined1 *)local_5a8.DimCount != local_598) {
                operator_delete((void *)local_5a8.DimCount);
              }
            }
          }
LAB_00148c09:
        }
      }
    }
  }
  return;
}

Assistant:

void SscReaderGeneric::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *dataString = reinterpret_cast<std::string *>(data);
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            GetDeferredDeltaCommon(variable, data);
        }
        else
        {
            for (const auto &i : m_AllReceivingWriterRanks)
            {
                const auto &v = m_GlobalWritePattern[i.first];
                for (const auto &b : v)
                {
                    if (b.name == variable.m_Name)
                    {
                        *dataString = std::string(b.value.begin(), b.value.end());
                    }
                }
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vShape(variable.m_Shape);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        GetDeferredDeltaCommon(variable, data);
    }
    else
    {

        for (const auto &i : m_AllReceivingWriterRanks)
        {
            const auto &v = m_GlobalWritePattern[i.first];
            for (const auto &b : v)
            {
                if (b.name == variable.m_Name)
                {
                    bool empty = false;
                    for (const auto c : b.count)
                    {
                        if (c == 0)
                        {
                            empty = true;
                        }
                    }
                    if (empty)
                    {
                        continue;
                    }

                    if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
                    {
                        helper::NdCopy(m_Buffer.data<char>() + b.bufferStart,
                                       helper::CoreDims(b.start), helper::CoreDims(b.count), true,
                                       true, reinterpret_cast<char *>(data), vStart, vCount, true,
                                       true, static_cast<int>(variable.m_ElementSize),
                                       helper::CoreDims(b.start), helper::CoreDims(b.count),
                                       vMemStart, vMemCount);
                    }
                    else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                    {
                        std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
                    }
                    else
                    {
                        helper::Log("Engine", "SscReaderGeneric", "GetDeferredCommon",
                                    "unknown ShapeID", m_ReaderRank, m_ReaderRank, 0, m_Verbosity,
                                    helper::LogMode::FATALERROR);
                    }
                }
            }
        }
    }
}